

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.cpp
# Opt level: O2

size_t cubeb_sample_size(cubeb_sample_format format)

{
  if (format < 4) {
    return *(size_t *)(&DAT_0010dad8 + (ulong)format * 8);
  }
  return 0;
}

Assistant:

size_t cubeb_sample_size(cubeb_sample_format format)
{
  switch (format) {
    case CUBEB_SAMPLE_S16LE:
    case CUBEB_SAMPLE_S16BE:
      return sizeof(int16_t);
    case CUBEB_SAMPLE_FLOAT32LE:
    case CUBEB_SAMPLE_FLOAT32BE:
      return sizeof(float);
    default:
      // should never happen as all cases are handled above.
      assert(false);
      return 0;
  }
}